

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O1

WavFileWriter * __thiscall
WavFileWriter::OpenWrite
          (WavFileWriter *this,AudioDescriptor *ADesc,char *file_root,SplitType_t split)

{
  double dVar1;
  Rational RVar2;
  Rational RVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ui32_t uVar10;
  uint uVar11;
  WavFileElement *pWVar12;
  _List_node_base *p_Var13;
  size_t sVar14;
  ILogSink *this_00;
  undefined4 in_register_0000000c;
  char *pcVar15;
  undefined1 *puVar16;
  int in_R8D;
  ulong uVar17;
  ui32_t uVar18;
  AudioDescriptor tmpDesc;
  Result_t result;
  SimpleRF64Header Wav;
  char filename [1024];
  AudioDescriptor local_578;
  WavFileWriter *local_540;
  AudioDescriptor *local_538;
  char *local_530;
  int local_528 [26];
  string local_4c0 [104];
  SimpleRF64Header local_458 [32];
  char local_438 [1032];
  
  pcVar15 = (char *)CONCAT44(in_register_0000000c,split);
  if (pcVar15 == (char *)0x0) {
    puVar16 = Kumu::RESULT_PTR;
LAB_0010b0ec:
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar16);
    return this;
  }
  if (*pcVar15 == '\0') {
    puVar16 = Kumu::RESULT_NULL_STR;
    goto LAB_0010b0ec;
  }
  Kumu::Result_t::Result_t((Result_t *)local_528,(Result_t *)Kumu::RESULT_OK);
  RVar2 = *(Rational *)file_root;
  RVar3 = *(Rational *)(file_root + 8);
  uVar4 = *(undefined8 *)(file_root + 0x10);
  uVar5 = *(undefined8 *)(file_root + 0x18);
  uVar6 = *(undefined8 *)(file_root + 0x20);
  uVar7 = *(undefined8 *)(file_root + 0x28);
  ADesc->AvgBps = (int)uVar6;
  ADesc->LinkedTrackID = (int)((ulong)uVar6 >> 0x20);
  ADesc->ContainerDuration = (int)uVar7;
  ADesc->ChannelFormat = (int)((ulong)uVar7 >> 0x20);
  ADesc->Locked = (int)uVar4;
  ADesc->ChannelCount = (int)((ulong)uVar4 >> 0x20);
  ADesc->QuantizationBits = (int)uVar5;
  ADesc->BlockAlign = (int)((ulong)uVar5 >> 0x20);
  ADesc->EditRate = RVar2;
  ADesc->AudioSamplingRate = RVar3;
  if (in_R8D == 2) {
    if ((ADesc->ChannelCount & 1) != 0) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"Unable to create 2-channel splits with odd number of input channels.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
      goto LAB_0010b480;
    }
    uVar18 = ADesc->ChannelCount >> 1;
    uVar10 = 2;
LAB_0010b11a:
    ADesc[1].QuantizationBits = uVar10;
  }
  else {
    if (in_R8D == 1) {
      uVar18 = ADesc->ChannelCount;
      uVar10 = 1;
      goto LAB_0010b11a;
    }
    uVar18 = 0;
    if (in_R8D == 0) {
      uVar10 = ADesc->ChannelCount;
      uVar18 = 1;
      goto LAB_0010b11a;
    }
  }
  local_540 = this;
  if ((uVar18 == 0) || (ADesc[1].QuantizationBits == 0)) {
    __assert_fail("file_count && m_ChannelCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/WavFileWriter.h"
                  ,0x89,
                  "ASDCP::Result_t WavFileWriter::OpenWrite(ASDCP::PCM::AudioDescriptor &, const char *, SplitType_t)"
                 );
  }
  uVar11 = ADesc->QuantizationBits;
  uVar10 = ADesc->ChannelCount;
  dVar1 = ceil(((double)(ADesc->AudioSamplingRate).Numerator /
               (double)(ADesc->AudioSamplingRate).Denominator) /
               ((double)(ADesc->EditRate).Numerator / (double)(ADesc->EditRate).Denominator));
  uVar11 = ((int)(long)dVar1 * (uVar11 >> 3) * uVar10) / uVar18;
  if (in_R8D == 0) {
    snprintf(local_438,0x400,"%s",pcVar15);
    pWVar12 = (WavFileElement *)operator_new(0x68);
    WavFileElement::WavFileElement(pWVar12,uVar11);
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)pWVar12;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    *(long *)&ADesc[1].Locked = *(long *)&ADesc[1].Locked + 1;
    local_578.EditRate = (Rational)&local_578.Locked;
    sVar14 = strlen(local_438);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_578,local_438,local_438 + sVar14);
    Kumu::FileWriter::OpenWrite(local_4c0);
    Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
    Kumu::Result_t::~Result_t((Result_t *)local_4c0);
    if (local_578.EditRate != (Rational)&local_578.Locked) {
      operator_delete((void *)local_578.EditRate,local_578._16_8_ + 1);
    }
    if (-1 < local_528[0]) {
      local_578.EditRate = ADesc->EditRate;
      local_578.AudioSamplingRate = ADesc->AudioSamplingRate;
      uVar9 = ADesc->Locked;
      local_578.QuantizationBits = ADesc->QuantizationBits;
      local_578.BlockAlign = ADesc->BlockAlign;
      local_578.AvgBps = ADesc->AvgBps;
      local_578.LinkedTrackID = ADesc->LinkedTrackID;
      local_578.ContainerDuration = ADesc->ContainerDuration;
      local_578.ChannelFormat = ADesc->ChannelFormat;
      local_578.ChannelCount = ADesc[1].QuantizationBits;
      local_578.Locked = uVar9;
      ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_458,&local_578);
      ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_4c0);
      Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
      Kumu::Result_t::~Result_t((Result_t *)local_4c0);
    }
  }
  else {
    local_530 = pcVar15;
    if (-1 < local_528[0]) {
      local_538 = ADesc + 1;
      uVar17 = 1;
      do {
        snprintf(local_438,0x400,"%s_%02u.wav",local_530,uVar17);
        pWVar12 = (WavFileElement *)operator_new(0x68);
        WavFileElement::WavFileElement(pWVar12,uVar11);
        p_Var13 = (_List_node_base *)operator_new(0x18);
        p_Var13[1]._M_next = (_List_node_base *)pWVar12;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        *(long *)&ADesc[1].Locked = *(long *)&ADesc[1].Locked + 1;
        local_578.EditRate = (Rational)&local_578.Locked;
        sVar14 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_578,local_438,local_438 + sVar14);
        Kumu::FileWriter::OpenWrite(local_4c0);
        Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
        Kumu::Result_t::~Result_t((Result_t *)local_4c0);
        if (local_578.EditRate != (Rational)&local_578.Locked) {
          operator_delete((void *)local_578.EditRate,local_578._16_8_ + 1);
        }
        if (-1 < local_528[0]) {
          local_578.EditRate = ADesc->EditRate;
          local_578.AudioSamplingRate = ADesc->AudioSamplingRate;
          uVar8 = ADesc->Locked;
          local_578.QuantizationBits = ADesc->QuantizationBits;
          local_578.BlockAlign = ADesc->BlockAlign;
          local_578.AvgBps = ADesc->AvgBps;
          local_578.LinkedTrackID = ADesc->LinkedTrackID;
          local_578.ContainerDuration = ADesc->ContainerDuration;
          local_578.ChannelFormat = ADesc->ChannelFormat;
          local_578.ChannelCount = ADesc[1].QuantizationBits;
          local_578.Locked = uVar8;
          ASDCP::RF64::SimpleRF64Header::SimpleRF64Header(local_458,&local_578);
          ASDCP::RF64::SimpleRF64Header::WriteToFile((FileWriter *)local_4c0);
          Kumu::Result_t::operator=((Result_t *)local_528,(Result_t *)local_4c0);
          Kumu::Result_t::~Result_t((Result_t *)local_4c0);
        }
      } while (((uint)uVar17 < uVar18) && (uVar17 = (ulong)((uint)uVar17 + 1), -1 < local_528[0]));
    }
  }
  this = local_540;
  Kumu::Result_t::Result_t((Result_t *)local_540,(Result_t *)local_528);
LAB_0010b480:
  Kumu::Result_t::~Result_t((Result_t *)local_528);
  return this;
}

Assistant:

ASDCP::Result_t
    OpenWrite(ASDCP::PCM::AudioDescriptor &ADesc, const char* file_root, SplitType_t split = ST_NONE)
    {
      ASDCP_TEST_NULL_STR(file_root);
      char filename[Kumu::MaxFilePath];
      ui32_t file_count = 0;
      ASDCP::Result_t result = ASDCP::RESULT_OK;
      m_ADesc = ADesc;

      switch ( split )
	{
	case ST_NONE:
	  file_count = 1;
	  m_ChannelCount = m_ADesc.ChannelCount;
	  break;

	case ST_MONO:
	  file_count = m_ADesc.ChannelCount;
	  m_ChannelCount = 1;
	  break;

	case ST_STEREO:
	  if ( m_ADesc.ChannelCount % 2 != 0 )
	    {
	      Kumu::DefaultLogSink().Error("Unable to create 2-channel splits with odd number of input channels.\n");
	      return ASDCP::RESULT_PARAM;
	    }

	  file_count = m_ADesc.ChannelCount / 2;
	  m_ChannelCount = 2;
	  break;
	}
      assert(file_count && m_ChannelCount);

      ui32_t element_size = ASDCP::PCM::CalcFrameBufferSize(m_ADesc) / file_count;
      if (split == ST_NONE)
      {
          snprintf(filename, Kumu::MaxFilePath, "%s", file_root);
          m_OutFile.push_back(new WavFileElement(element_size));
          result = m_OutFile.back()->OpenWrite(filename);
          if ( ASDCP_SUCCESS(result) )
          {
              ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
              tmpDesc.ChannelCount = m_ChannelCount;
              ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
              result = Wav.WriteToFile(*(m_OutFile.back()));
          }
      }
      else
      {
          for ( ui32_t i = 0; i < file_count && ASDCP_SUCCESS(result); i++ )
          {
              snprintf(filename, Kumu::MaxFilePath, "%s_%02u.wav", file_root, (i + 1));
              m_OutFile.push_back(new WavFileElement(element_size));
              result = m_OutFile.back()->OpenWrite(filename);

              if ( ASDCP_SUCCESS(result) )
              {
                  ASDCP::PCM::AudioDescriptor tmpDesc = m_ADesc;
                  tmpDesc.ChannelCount = m_ChannelCount;
                  ASDCP::RF64::SimpleRF64Header Wav(tmpDesc);
                  result = Wav.WriteToFile(*(m_OutFile.back()));
              }
          }
      }
      return result;
    }